

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool __thiscall re2::RE2::CheckRewriteString(RE2 *this,StringPiece *rewrite,string *error)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  
  pcVar2 = rewrite->ptr_;
  pcVar3 = pcVar2 + rewrite->length_;
  uVar5 = 0xffffffff;
  do {
    if (pcVar3 <= pcVar2) {
      iVar1 = NumberOfCapturingGroups(this);
      if (iVar1 < (int)uVar5) {
        uVar4 = NumberOfCapturingGroups(this);
        SStringPrintf(error,
                      "Rewrite schema requests %d matches, but the regexp only has %d parenthesized subexpressions."
                      ,(ulong)uVar5,(ulong)uVar4);
      }
      return iVar1 >= (int)uVar5;
    }
    if (*pcVar2 == '\\') {
      pcVar2 = pcVar2 + 1;
      if (pcVar2 == pcVar3) {
LAB_00129733:
        std::__cxx11::string::assign((char *)error);
        return false;
      }
      if (*pcVar2 != 0x5c) {
        uVar4 = (int)*pcVar2 - 0x30;
        if (9 < uVar4) goto LAB_00129733;
        if ((int)uVar5 <= (int)uVar4) {
          uVar5 = uVar4;
        }
      }
    }
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

bool RE2::CheckRewriteString(const StringPiece& rewrite, string* error) const {
  int max_token = -1;
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    int c = *s;
    if (c != '\\') {
      continue;
    }
    if (++s == end) {
      *error = "Rewrite schema error: '\\' not allowed at end.";
      return false;
    }
    c = *s;
    if (c == '\\') {
      continue;
    }
    if (!isdigit(c)) {
      *error = "Rewrite schema error: "
               "'\\' must be followed by a digit or '\\'.";
      return false;
    }
    int n = (c - '0');
    if (max_token < n) {
      max_token = n;
    }
  }

  if (max_token > NumberOfCapturingGroups()) {
    SStringPrintf(error, "Rewrite schema requests %d matches, "
                  "but the regexp only has %d parenthesized subexpressions.",
                  max_token, NumberOfCapturingGroups());
    return false;
  }
  return true;
}